

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void soul::heart::Printer::print(Program *p,CodePrinter *out)

{
  pointer ppVar1;
  size_t sVar2;
  CodePrinter *pCVar3;
  pointer ppVar4;
  string_view text;
  char s [2];
  char local_9a [2];
  CodePrinter *local_98;
  undefined1 local_90 [16];
  _Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_9a[0] = '#';
  local_9a[1] = '\0';
  local_90._0_8_ = &local_80;
  sVar2 = strlen(local_9a);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,local_9a,local_9a + sVar2);
  local_98 = out;
  choc::text::CodePrinter::append(out,(string *)local_90);
  if ((_Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)local_90._0_8_ != &local_80) {
    operator_delete((void *)local_90._0_8_,(long)local_80._M_buckets + 1);
  }
  pCVar3 = local_98;
  text._M_str = "SOUL";
  text._M_len = 4;
  choc::text::CodePrinter::writeBlock(local_98,text);
  local_9a[0] = ' ';
  local_9a[1] = '\0';
  local_90._0_8_ = &local_80;
  sVar2 = strlen(local_9a);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,local_9a,local_9a + sVar2);
  choc::text::CodePrinter::append(pCVar3,(string *)local_90);
  if ((_Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)local_90._0_8_ != &local_80) {
    operator_delete((void *)local_90._0_8_,(long)local_80._M_buckets + 1);
  }
  pCVar3 = choc::text::CodePrinter::operator<<(local_98,1);
  choc::text::CodePrinter::operator<<(pCVar3,(BlankLine *)&blankLine);
  ppVar4 = (p->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (p->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    do {
      local_90._0_8_ = ppVar4->object;
      local_90._8_8_ = local_98;
      local_80._M_bucket_count = 1;
      local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_80._M_element_count = 0;
      local_80._M_rehash_policy._M_max_load_factor = 1.0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80._M_rehash_policy._M_next_resize = 0;
      local_80._M_single_bucket = (__node_base_ptr)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80._M_buckets = &local_80._M_single_bucket;
      PrinterStream::printAll((PrinterStream *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      _Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_80);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  return;
}

Assistant:

static void print (const Program& p, choc::text::CodePrinter& out)
    {
        out << '#' << getHEARTFormatVersionPrefix() << ' ' << getHEARTFormatVersion() << blankLine;

        for (auto& module : p.getModules())
            PrinterStream (module, out).printAll();
    }